

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collator.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
booster::locale::impl_icu::collate_impl<wchar_t>::do_basic_transform
          (collate_impl<wchar_t> *this,level_type level,wchar_t *b,wchar_t *e)

{
  int iVar1;
  Collator *pCVar2;
  reference pvVar3;
  size_type sVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  int len;
  Collator *collate;
  UnicodeString str;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *tmp;
  UnicodeString *in_stack_ffffffffffffff20;
  Collator *pCVar5;
  char_type_conflict *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  int iVar6;
  icu_std_converter<wchar_t,_4> *in_stack_ffffffffffffff48;
  UnicodeString local_68 [12];
  level_type in_stack_ffffffffffffffa4;
  collate_impl<wchar_t> *in_stack_ffffffffffffffa8;
  
  icu_std_converter<wchar_t,_4>::icu
            (in_stack_ffffffffffffff48,
             (char_type_conflict *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             in_stack_ffffffffffffff38);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x262c9d);
  icu_70::UnicodeString::length(in_stack_ffffffffffffff20);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             (size_type)in_stack_ffffffffffffff38);
  pCVar2 = get_collator(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
  pCVar5 = pCVar2;
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](in_RDI,0);
  sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_RDI);
  iVar1 = (**(code **)(*(long *)pCVar5 + 0x108))(pCVar5,local_68,pvVar3,sVar4 & 0xffffffff);
  iVar6 = iVar1;
  sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_RDI);
  if ((int)sVar4 < iVar1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(iVar6,in_stack_ffffffffffffff40),(size_type)pvVar3);
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](in_RDI,0);
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_RDI);
    (**(code **)(*(long *)pCVar2 + 0x108))(pCVar2,local_68,pvVar3,sVar4 & 0xffffffff);
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(iVar6,in_stack_ffffffffffffff40),(size_type)pvVar3);
  }
  icu_70::UnicodeString::~UnicodeString(local_68);
  return in_RDI;
}

Assistant:

std::vector<uint8_t> do_basic_transform(level_type level,CharType const *b,CharType const *e) const 
                {
                    icu::UnicodeString str=cvt_.icu(b,e);
                    std::vector<uint8_t> tmp;
                    tmp.resize(str.length());
                    icu::Collator *collate = get_collator(level);
                    int len = collate->getSortKey(str,&tmp[0],tmp.size());
                    if(len > int(tmp.size())) {
                        tmp.resize(len);
                        collate->getSortKey(str,&tmp[0],tmp.size());
                    }
                    else 
                        tmp.resize(len);
                    return tmp;
                }